

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O3

int __thiscall QtMWidgets::TableViewPrivate::init(TableViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  AbstractScrollArea *this_00;
  int extraout_EAX;
  QWidget *pQVar1;
  QWidget *pQVar2;
  QVBoxLayout *this_01;
  undefined8 *puVar3;
  
  this_00 = (this->super_ScrollAreaPrivate).super_AbstractScrollAreaPrivate.q;
  pQVar1 = (QWidget *)operator_new(0x28);
  pQVar2 = AbstractScrollArea::viewport(this_00);
  QWidget::QWidget(pQVar1,pQVar2,0);
  this->widget = pQVar1;
  QWidget::setSizePolicy((QSizePolicy)SUB84(pQVar1,0));
  this_01 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_01,this->widget);
  this->layout = this_01;
  (**(code **)(*(long *)this_01 + 0x68))(this_01,0);
  QLayout::setContentsMargins((int)this->layout,6,6,6);
  puVar3 = (undefined8 *)operator_new(0x28);
  *puVar3 = _ITM_deregisterTMCloneTable;
  puVar3[1] = 0;
  puVar3[2] = 0x71000000000000;
  *(undefined4 *)(puVar3 + 3) = 0;
  *(undefined4 *)((long)puVar3 + 0x1c) = 0;
  *(undefined4 *)(puVar3 + 4) = 0xffffffff;
  *(undefined4 *)((long)puVar3 + 0x24) = 0xffffffff;
  (**(code **)(*(long *)this->layout + 0x80))(this->layout,puVar3);
  QWidget::setBackgroundRole((ColorRole)this_00);
  QWidget::setAutoFillBackground(SUB81(this_00,0));
  ScrollArea::setWidgetResizable((ScrollArea *)this_00,true);
  ScrollArea::setWidget((ScrollArea *)this_00,this->widget);
  return extraout_EAX;
}

Assistant:

void
TableViewPrivate::init()
{
	TableView * q = q_func();

	widget = new QWidget( q->viewport() );
	QSizePolicy sp = QSizePolicy( QSizePolicy::Minimum,
		QSizePolicy::Minimum );
	sp.setHeightForWidth( true );
	widget->setSizePolicy( sp );
	layout = new QVBoxLayout( widget );
	layout->setSpacing( 0 );
	layout->setContentsMargins( 6, 6, 6, 6 );

	QSpacerItem * spacer = new QSpacerItem( 0, 0, QSizePolicy::Minimum,
		QSizePolicy::Expanding );
	layout->addItem( spacer );

	q->setBackgroundRole( QPalette::Midlight );
	q->setAutoFillBackground( true );
	q->setWidgetResizable( true );
	q->setWidget( widget );
}